

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedTimeZone::getOffset
          (RuleBasedTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,
          uint8_t dayOfWeek,int32_t millis,UErrorCode *status)

{
  int iVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((uint)month < 0xc) {
      iVar1 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                        (this,(ulong)era);
      return iVar1;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

int32_t
RuleBasedTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                             uint8_t dayOfWeek, int32_t millis, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (month < UCAL_JANUARY || month > UCAL_DECEMBER) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    } else {
        return getOffset(era, year, month, day, dayOfWeek, millis,
                         Grego::monthLength(year, month), status);
    }
}